

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O0

REF_STATUS ref_smooth_valid_no_geom_tri(REF_GRID ref_grid,REF_INT node,REF_BOOL *allowed)

{
  REF_NODE ref_node_00;
  REF_CELL ref_cell_00;
  uint uVar1;
  REF_INT local_d0;
  REF_INT local_cc;
  int local_c8;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL valid;
  REF_INT nodes [27];
  REF_INT local_40;
  int local_3c;
  REF_INT cell;
  REF_INT item;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_BOOL *allowed_local;
  REF_INT node_local;
  REF_GRID ref_grid_local;
  
  ref_node_00 = ref_grid->node;
  if (ref_grid->twod == 0) {
    *allowed = 1;
  }
  else {
    *allowed = 0;
    ref_cell_00 = ref_grid->cell[3];
    if ((node < 0) || (ref_cell_00->ref_adj->nnode <= node)) {
      local_c8 = -1;
    }
    else {
      local_c8 = ref_cell_00->ref_adj->first[node];
    }
    local_3c = local_c8;
    if (local_c8 == -1) {
      local_cc = -1;
    }
    else {
      local_cc = ref_cell_00->ref_adj->item[local_c8].ref;
    }
    local_40 = local_cc;
    while (local_3c != -1) {
      uVar1 = ref_cell_nodes(ref_cell_00,local_40,&ref_private_macro_code_rss);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
               0x108,"ref_smooth_valid_no_geom_tri",(ulong)uVar1,"nodes");
        return uVar1;
      }
      uVar1 = ref_node_tri_twod_orientation
                        (ref_node_00,&ref_private_macro_code_rss,&ref_private_macro_code_rss_1);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
               0x109,"ref_smooth_valid_no_geom_tri",(ulong)uVar1,"valid");
        return uVar1;
      }
      if (ref_private_macro_code_rss_1 == 0) {
        return 0;
      }
      local_3c = ref_cell_00->ref_adj->item[local_3c].next;
      if (local_3c == -1) {
        local_d0 = -1;
      }
      else {
        local_d0 = ref_cell_00->ref_adj->item[local_3c].ref;
      }
      local_40 = local_d0;
    }
    *allowed = 1;
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_smooth_valid_no_geom_tri(REF_GRID ref_grid,
                                                       REF_INT node,
                                                       REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT item, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL valid;

  if (!ref_grid_twod(ref_grid)) {
    *allowed = REF_TRUE;
    return REF_SUCCESS;
  }

  *allowed = REF_FALSE;

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    RSS(ref_node_tri_twod_orientation(ref_node, nodes, &valid), "valid");
    if (!valid) return REF_SUCCESS;
  }

  *allowed = REF_TRUE;

  return REF_SUCCESS;
}